

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O2

int __thiscall TokenStreamTokenizer::init(TokenStreamTokenizer *this,EVP_PKEY_CTX *ctx)

{
  Token *pTVar1;
  _List_node_base *p_Var2;
  Token *pTVar3;
  Token local_80;
  
  std::__cxx11::list<Token,_std::allocator<Token>_>::clear
            ((list<Token,_std::allocator<Token>_> *)this);
  pTVar1 = *(Token **)(ctx + 8);
  for (pTVar3 = *(Token **)ctx; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    Token::Token(&local_80,pTVar3);
    Tokenizer::addToken(&this->super_Tokenizer,&local_80);
    Token::~Token(&local_80);
  }
  p_Var2 = (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  (this->super_Tokenizer).position.it._M_node = p_Var2;
  return (int)p_Var2;
}

Assistant:

void init(const std::vector<Token>& tokens)
	{
		clearTokens();

		for (const Token &tok: tokens)
			addToken(tok);
		
		resetPosition();
	}